

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rename.c
# Opt level: O0

int Curl_rename(char *oldpath,char *newpath)

{
  int iVar1;
  char *newpath_local;
  char *oldpath_local;
  
  iVar1 = rename(oldpath,newpath);
  oldpath_local._4_4_ = (uint)(iVar1 != 0);
  return oldpath_local._4_4_;
}

Assistant:

int Curl_rename(const char *oldpath, const char *newpath)
{
#ifdef _WIN32
  /* rename() on Windows doesn't overwrite, so we can't use it here.
     MoveFileEx() will overwrite and is usually atomic, however it fails
     when there are open handles to the file. */
  const int max_wait_ms = 1000;
  struct curltime start = Curl_now();
  TCHAR *tchar_oldpath = curlx_convert_UTF8_to_tchar((char *)oldpath);
  TCHAR *tchar_newpath = curlx_convert_UTF8_to_tchar((char *)newpath);
  for(;;) {
    timediff_t diff;
    if(MoveFileEx(tchar_oldpath, tchar_newpath, MOVEFILE_REPLACE_EXISTING)) {
      curlx_unicodefree(tchar_oldpath);
      curlx_unicodefree(tchar_newpath);
      break;
    }
    diff = Curl_timediff(Curl_now(), start);
    if(diff < 0 || diff > max_wait_ms) {
      curlx_unicodefree(tchar_oldpath);
      curlx_unicodefree(tchar_newpath);
      return 1;
    }
    Sleep(1);
  }
#else
  if(rename(oldpath, newpath))
    return 1;
#endif
  return 0;
}